

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.h
# Opt level: O1

void __thiscall
psql::
channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::write<psql::parse_message>
          (channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *this,parse_message *msg,bool write_msg_type)

{
  size_t sVar1;
  size_t sVar2;
  size_t __n;
  size_t __n_00;
  pointer puVar3;
  undefined8 uVar4;
  type x2_1;
  undefined7 in_register_00000011;
  uint *puVar5;
  type x2;
  uint uVar6;
  int local_90;
  uint uStack_8c;
  error_category *peStack_88;
  pointer local_80;
  long local_78;
  pointer *local_70 [2];
  error_code local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  sVar1 = (msg->name).super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>.
          value._M_len;
  sVar2 = (msg->statement).
          super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>.value._M_len;
  uVar6 = (int)sVar2 + 8 + (int)sVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->shared_buff_,
             (CONCAT71(in_register_00000011,write_msg_type) & 0xffffffff) + sVar2 + sVar1 + 8);
  puVar5 = (uint *)(this->shared_buff_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000011,write_msg_type) != 0) {
    *(uchar *)puVar5 = 'P';
    puVar5 = (uint *)((long)puVar5 + 1);
  }
  *puVar5 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 * 0x1000000;
  __n = (msg->name).super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>.value
        ._M_len;
  memcpy(puVar5 + 1,
         (msg->name).super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>.
         value._M_str,__n);
  *(uchar *)((long)puVar5 + __n + 4) = '\0';
  __n_00 = (msg->statement).
           super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>.value._M_len;
  memcpy((pointer)((long)puVar5 + __n + 5),
         (msg->statement).super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>
         .value._M_str,__n_00);
  *(uchar *)((long)puVar5 + __n_00 + 1 + __n + 4) = '\0';
  *(ushort *)((long)puVar5 + __n_00 + 2 + __n + 4) =
       msg->num_params << 8 | (ushort)msg->num_params >> 8;
  puVar3 = (this->shared_buff_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_78 = (long)(this->shared_buff_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar3;
  local_80 = (pointer)0x0;
  if (local_78 != 0) {
    local_80 = puVar3;
  }
  local_70[0] = &local_80;
  local_90 = 0;
  uStack_8c = uStack_8c & 0xffffff00;
  peStack_88 = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t>
            (this->stream_,local_70[0],(system_error *)local_70,&local_90);
  local_60.cat_ = peStack_88;
  if ((char)uStack_8c != '\x01') {
    return;
  }
  uVar4._4_4_ = uStack_8c;
  uVar4._0_4_ = local_90;
  std::runtime_error::runtime_error((runtime_error *)local_70,"write");
  local_70[0] = &PTR__system_error_0011a088;
  local_50._M_p = (pointer)((long)&((system_error *)local_70)->m_what + 0x10);
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_60._0_8_ = uVar4;
  boost::throw_exception<boost::system::system_error>((system_error *)local_70);
}

Assistant:

void write(const Message& msg, bool write_msg_type=true)
	{
		serialization_context ctx;

		std::size_t effective_size = 4 + get_size(msg, ctx);
		std::size_t buffer_size = effective_size +  (write_msg_type ? 1 : 0);

		shared_buff_.resize(buffer_size);
		ctx.set_first(shared_buff_.data());

		if (write_msg_type)
		{
			serialize(Message::message_type, ctx);
		}
		serialize(std::uint32_t(effective_size), ctx);
		serialize(msg, ctx);

		boost::asio::write(stream_, boost::asio::buffer(shared_buff_));
	}